

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Explosion.cpp
# Opt level: O3

void __thiscall Explosion::render(Explosion *this,int offx,int offy)

{
  float fVar1;
  ResourceManager *this_00;
  void *pvVar2;
  
  this_00 = ResourceManager::getInstance();
  pvVar2 = ResourceManager::getData(this_00,this->currFrame + (this->big ^ 1) * 5 + 9);
  fVar1 = (this->super_Entity).radius;
  al_draw_rotated_bitmap
            (fVar1,fVar1,(float)offx + (this->super_Entity).x,(float)offy + (this->super_Entity).y,0
             ,pvVar2,0);
  return;
}

Assistant:

void Explosion::render(int offx, int offy)
{
   ResourceManager& rm = ResourceManager::getInstance();
   ALLEGRO_BITMAP *bitmap;
   int bitmapIndex;

   if (big)
      bitmapIndex = RES_LARGEEXPLOSION0 + currFrame;
   else
      bitmapIndex = RES_SMALLEXPLOSION0 + currFrame;

   bitmap = (ALLEGRO_BITMAP *)rm.getData(bitmapIndex);

   al_draw_rotated_bitmap(bitmap, radius, radius, offx + x, offy + y, 0, 0);
}